

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O2

mt19937 * random_engine(void)

{
  undefined4 in_EAX;
  int iVar1;
  uint uVar2;
  undefined4 in_register_00000004;
  undefined8 uVar3;
  mt19937 *pmVar4;
  
  iVar1 = CONCAT31((int3)((uint)in_EAX >> 8),random_engine()::random_device);
  if (random_engine()::random_device == '\0') {
    uVar3 = __cxa_guard_acquire(&random_engine()::random_device);
    in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
    iVar1 = (int)uVar3;
    if (iVar1 != 0) {
      std::random_device::random_device(&random_engine::random_device);
      __cxa_atexit(std::random_device::~random_device,&random_engine::random_device,&__dso_handle);
      uVar3 = __cxa_guard_release(&random_engine()::random_device);
      in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
      iVar1 = (int)uVar3;
    }
  }
  pmVar4 = (mt19937 *)
           CONCAT44(in_register_00000004,CONCAT31((int3)((uint)iVar1 >> 8),random_engine()::smt));
  if (random_engine()::smt == '\0') {
    pmVar4 = (mt19937 *)__cxa_guard_acquire(&random_engine()::smt);
    if ((int)pmVar4 != 0) {
      uVar2 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&random_engine::smt,(ulong)uVar2);
      pmVar4 = (mt19937 *)__cxa_guard_release(&random_engine()::smt);
      return pmVar4;
    }
  }
  return pmVar4;
}

Assistant:

static std::mt19937& random_engine() {
    static std::random_device random_device;
    static std::mt19937 smt(random_device());
    return smt;
}